

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O0

void __thiscall QNetworkAccessCache::releaseEntry(QNetworkAccessCache *this,QByteArray *key)

{
  long lVar1;
  int iVar2;
  Node *this_00;
  char *pcVar3;
  QHash<QByteArray,_QNetworkAccessCache::Node_*> *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  Node *node;
  QByteArray *in_stack_ffffffffffffffc0;
  QMessageLogger *this_01;
  QByteArray *in_stack_ffffffffffffffd8;
  QNetworkAccessCache *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = QHash<QByteArray,_QNetworkAccessCache::Node_*>::value(in_RSI,in_stack_ffffffffffffffc0);
  if (this_00 == (Node *)0x0) {
    QMessageLogger::QMessageLogger(this_01,(char *)in_RSI,0,(char *)in_RDI);
    pcVar3 = QByteArray::constData((QByteArray *)0x193831);
    QMessageLogger::warning
              (&stack0xffffffffffffffd8,
               "QNetworkAccessCache::releaseEntry: trying to release key \'%s\' that is not in cache"
               ,pcVar3);
  }
  else {
    iVar2 = this_00->useCount + -1;
    this_00->useCount = iVar2;
    if (iVar2 == 0) {
      if ((this_00->object->expires & 1U) != 0) {
        linkEntry(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      }
      if ((Node *)(in_RDI->context).category == this_00) {
        updateTimer((QNetworkAccessCache *)this_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessCache::releaseEntry(const QByteArray &key)
{
    Node *node = hash.value(key);
    if (!node) {
        qWarning("QNetworkAccessCache::releaseEntry: trying to release key '%s' that is not in cache", key.constData());
        return;
    }

    Q_ASSERT(node->useCount > 0);

    if (!--node->useCount) {
        // no objects waiting; add it back to the expiry list
        if (node->object->expires)
            linkEntry(key);

        if (firstExpiringNode == node)
            updateTimer();
    }
}